

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int set_str_utf16be(archive_write *a,uchar *p,char *s,size_t l,uint16_t uf,vdc vdc)

{
  void *pvVar1;
  wchar_t wVar2;
  size_t n;
  int *piVar3;
  ulong uVar4;
  ushort uVar5;
  uint uVar6;
  uchar *p_1;
  ulong uVar7;
  undefined2 in_register_00000082;
  short *__s;
  ulong __n;
  long lVar8;
  
  __s = (short *)0x59497a;
  if (s != (char *)0x0) {
    __s = (short *)s;
  }
  uVar7 = l & 0xfffffffffffffffe;
  if (CONCAT22(in_register_00000082,uf) == 2) {
    pvVar1 = a->format_data;
    n = strlen((char *)__s);
    wVar2 = archive_strncpy_l((archive_string *)((long)pvVar1 + 0x48),__s,n,
                              *(archive_string_conv **)((long)pvVar1 + 0x78));
    if ((wVar2 != L'\0') && (piVar3 = __errno_location(), *piVar3 == 0xc)) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for UTF-16BE");
      return -0x1e;
    }
    __n = *(ulong *)((long)pvVar1 + 0x50);
    if (uVar7 <= *(ulong *)((long)pvVar1 + 0x50)) {
      __n = uVar7;
    }
    memcpy(p,*(void **)((long)pvVar1 + 0x48),__n);
  }
  else {
    if (*__s == 0) {
      __n = 0;
    }
    else {
      uVar4 = 0;
      do {
        __n = uVar4 + 2;
        lVar8 = uVar4 + 2;
        uVar4 = __n;
      } while (*(short *)((long)__s + lVar8) != 0);
    }
    if (uVar7 <= __n) {
      __n = uVar7;
    }
    memcpy(p,__s,__n);
  }
  if (__n != 0) {
    uVar4 = 0;
    do {
      uVar5 = *(ushort *)(p + uVar4) << 8 | *(ushort *)(p + uVar4) >> 8;
      if ((uVar5 < 0x20) ||
         ((uVar6 = uVar5 - 0x2a, uVar6 < 0x33 &&
          ((0x4000000230021U >> ((ulong)uVar6 & 0x3f) & 1) != 0)))) {
        (p + uVar4)[0] = '\0';
        (p + uVar4)[1] = '_';
      }
      uVar4 = uVar4 + 2;
    } while (uVar4 < __n);
    p = p + uVar4;
  }
  if (uVar7 != __n) {
    lVar8 = __n - uVar7;
    do {
      p[0] = '\0';
      p[1] = ' ';
      p = p + 2;
      lVar8 = lVar8 + 2;
    } while (lVar8 != 0);
  }
  if ((l & 1) != 0) {
    *p = '\0';
  }
  return 0;
}

Assistant:

static int
set_str_utf16be(struct archive_write *a, unsigned char *p, const char *s,
    size_t l, uint16_t uf, enum vdc vdc)
{
	size_t size, i;
	int onepad;

	if (s == NULL)
		s = "";
	if (l & 0x01) {
		onepad = 1;
		l &= ~1;
	} else
		onepad = 0;
	if (vdc == VDC_UCS2) {
		struct iso9660 *iso9660 = a->format_data;
		if (archive_strncpy_l(&iso9660->utf16be, s, strlen(s),
		    iso9660->sconv_to_utf16be) != 0 && errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for UTF-16BE");
			return (ARCHIVE_FATAL);
		}
		size = iso9660->utf16be.length;
		if (size > l)
			size = l;
		memcpy(p, iso9660->utf16be.s, size);
	} else {
		const uint16_t *u16 = (const uint16_t *)s;

		size = 0;
		while (*u16++)
			size += 2;
		if (size > l)
			size = l;
		memcpy(p, s, size);
	}
	for (i = 0; i < size; i += 2, p += 2) {
		if (!joliet_allowed_char(p[0], p[1]))
			archive_be16enc(p, 0x005F);/* '_' */
	}
	l -= size;
	while (l > 0) {
		archive_be16enc(p, uf);
		p += 2;
		l -= 2;
	}
	if (onepad)
		*p = 0;
	return (ARCHIVE_OK);
}